

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O0

void __thiscall GraphEditor::apply_all(GraphEditor *this)

{
  Support support;
  Support support_00;
  Support support_01;
  Support support_02;
  long lVar1;
  bool bVar2;
  bool bVar3;
  pointer pGVar4;
  pointer pGVar5;
  pointer pGVar6;
  ulong uVar7;
  size_type sVar8;
  sgNodeID_t sVar9;
  pointer pGVar10;
  SequenceDistanceGraph *pSVar11;
  reference pvVar12;
  reference pLVar13;
  sgNodeID_t *in_RDI;
  Link l_3;
  iterator __end5_3;
  iterator __begin5_3;
  vector<Link,_std::allocator<Link>_> *__range5_3;
  Link l_2;
  iterator __end5_2;
  iterator __begin5_2;
  vector<Link,_std::allocator<Link>_> *__range5_2;
  int32_t last_dist;
  int32_t first_dist;
  sgNodeID_t new_node_1;
  Link l_1;
  iterator __end5_1;
  iterator __begin5_1;
  vector<Link,_std::allocator<Link>_> *__range5_1;
  Link l;
  iterator __end5;
  iterator __begin5;
  vector<Link,_std::allocator<Link>_> *__range5;
  GraphEditorPathDetachment *op_3;
  int32_t dest_dist;
  int32_t source_dist;
  sgNodeID_t new_node;
  int li;
  GraphEditorNodeExpansion *op_2;
  GraphEditorLinkDeletion *op_1;
  GraphEditorNodeDeletion *op;
  uint64_t i;
  iterator next_detachment;
  iterator next_expansion;
  iterator next_link_deletion;
  iterator next_node_deletion;
  vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>
  *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  SequenceDistanceGraph *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 uVar14;
  value_type in_stack_fffffffffffffb40;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffb48;
  DistanceGraph *in_stack_fffffffffffffb50;
  sgNodeID_t in_stack_fffffffffffffb58;
  SequenceDistanceGraph *in_stack_fffffffffffffb60;
  SequenceDistanceGraph *in_stack_fffffffffffffb68;
  int64_t in_stack_fffffffffffffb70;
  value_type in_stack_fffffffffffffbd8;
  sgNodeID_t in_stack_fffffffffffffbe0;
  DistanceGraph *in_stack_fffffffffffffbe8;
  Support local_378;
  Support local_368;
  sgNodeID_t local_358;
  sgNodeID_t sStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  int64_t local_338;
  Link *local_328;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_320;
  undefined1 local_318 [24];
  undefined1 *local_300;
  sgNodeID_t local_2f8;
  sgNodeID_t sStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int64_t local_2d8;
  Link *local_2c8;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_2c0;
  undefined1 local_2b8 [24];
  undefined1 *local_2a0;
  undefined4 local_288;
  undefined4 local_26c;
  undefined4 local_258;
  SequenceDistanceGraphPath *in_stack_fffffffffffffdb8;
  string local_200 [32];
  SequenceDistanceGraph *local_1e0;
  undefined1 local_1d8 [8];
  long local_1d0;
  Link *local_1b0;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_1a8;
  undefined1 local_1a0 [24];
  undefined1 *local_188;
  undefined1 local_180 [8];
  long local_178;
  Link *local_158;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_150;
  undefined1 local_148 [24];
  undefined1 *local_130;
  reference local_128;
  GraphEditorPathDetachment *local_120;
  Support local_118 [2];
  undefined4 local_f8;
  undefined4 local_dc;
  Support local_d8 [2];
  undefined4 local_b8;
  undefined4 local_a0;
  string local_90 [32];
  sgNodeID_t local_70;
  int local_64;
  reference local_60;
  GraphEditorNodeExpansion *local_58;
  reference local_50;
  GraphEditorLinkDeletion *local_48;
  reference local_40;
  GraphEditorNodeDeletion *local_38;
  ulong local_30;
  __normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
  local_28;
  __normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
  local_20;
  __normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
  local_18;
  __normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (GraphEditorNodeDeletion *)
       std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::begin
                 ((vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_> *)
                  in_stack_fffffffffffffaf8);
  local_18._M_current =
       (GraphEditorLinkDeletion *)
       std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::begin
                 (in_stack_fffffffffffffaf8);
  local_20._M_current =
       (GraphEditorNodeExpansion *)
       std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::begin
                 ((vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_> *)
                  in_stack_fffffffffffffaf8);
  local_28._M_current =
       (GraphEditorPathDetachment *)
       std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::begin
                 ((vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_> *)
                  in_stack_fffffffffffffaf8);
  for (local_30 = 0; local_30 < (ulong)in_RDI[0x1c]; local_30 = local_30 + 1) {
    local_38 = (GraphEditorNodeDeletion *)
               std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::end
                         ((vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>
                           *)in_stack_fffffffffffffaf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
                        *)in_stack_fffffffffffffaf8);
    bVar3 = false;
    if (bVar2) {
      pGVar4 = __gnu_cxx::
               __normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
               ::operator->(local_10);
      bVar3 = (pGVar4->super_GraphEditorOperation).index == local_30;
    }
    if (bVar3) {
      local_40 = __gnu_cxx::
                 __normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
                 ::operator*(local_10);
      std::vector<long,_std::allocator<long>_>::operator[]
                (&(local_40->super_GraphEditorOperation).input_nodes,0);
      SequenceDistanceGraph::remove_node(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<GraphEditorNodeDeletion_*,_std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>_>
      ::operator++(local_10);
    }
    local_48 = (GraphEditorLinkDeletion *)
               std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::end
                         (in_stack_fffffffffffffaf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
                        *)in_stack_fffffffffffffaf8);
    bVar3 = false;
    if (bVar2) {
      pGVar5 = __gnu_cxx::
               __normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
               ::operator->(&local_18);
      bVar3 = (pGVar5->super_GraphEditorOperation).index == local_30;
    }
    if (bVar3) {
      local_50 = __gnu_cxx::
                 __normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
                 ::operator*(&local_18);
      std::vector<long,_std::allocator<long>_>::operator[]
                (&(local_50->super_GraphEditorOperation).input_ends,0);
      std::vector<long,_std::allocator<long>_>::operator[]
                (&(local_50->super_GraphEditorOperation).input_ends,1);
      DistanceGraph::remove_link
                (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      __gnu_cxx::
      __normal_iterator<GraphEditorLinkDeletion_*,_std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>_>
      ::operator++(&local_18);
    }
    local_58 = (GraphEditorNodeExpansion *)
               std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::end
                         ((vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
                           *)in_stack_fffffffffffffaf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
                        *)in_stack_fffffffffffffaf8);
    bVar3 = false;
    if (bVar2) {
      pGVar6 = __gnu_cxx::
               __normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
               ::operator->(&local_20);
      bVar3 = (pGVar6->super_GraphEditorOperation).index == local_30;
    }
    if (bVar3) {
      local_60 = __gnu_cxx::
                 __normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
                 ::operator*(&local_20);
      for (local_64 = 0; uVar7 = (ulong)local_64,
          sVar8 = std::vector<long,_std::allocator<long>_>::size
                            (&(local_60->super_GraphEditorOperation).input_ends), uVar7 < sVar8 >> 1
          ; local_64 = local_64 + 1) {
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_60->super_GraphEditorOperation).input_nodes,0);
        SequenceDistanceGraph::get_node_sequence_abi_cxx11_
                  (in_stack_fffffffffffffb68,(sgNodeID_t)in_stack_fffffffffffffb60);
        sVar9 = SequenceDistanceGraph::add_node
                          (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                           SUB81((ulong)in_stack_fffffffffffffaf8 >> 0x38,0));
        std::__cxx11::string::~string(local_90);
        local_70 = sVar9;
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&(local_60->super_GraphEditorOperation).input_ends,
                             (long)(local_64 << 1));
        in_stack_fffffffffffffbd8 = *pvVar12;
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_60->super_GraphEditorOperation).input_nodes,0);
        DistanceGraph::get_link
                  (in_stack_fffffffffffffb50,(sgNodeID_t)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40);
        local_a0 = local_b8;
        in_stack_fffffffffffffbe0 = *in_RDI;
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&(local_60->super_GraphEditorOperation).input_ends,
                             (long)(local_64 << 1));
        in_stack_fffffffffffffbe8 = (DistanceGraph *)*pvVar12;
        Support::Support(local_d8,Undefined,0,0);
        support.id = in_stack_fffffffffffffb70;
        support._0_8_ = in_stack_fffffffffffffb68;
        DistanceGraph::add_link
                  (&in_stack_fffffffffffffb60->super_DistanceGraph,in_stack_fffffffffffffb58,
                   (sgNodeID_t)in_stack_fffffffffffffb50,
                   (int32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),support);
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_60->super_GraphEditorOperation).input_nodes,0);
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_60->super_GraphEditorOperation).input_ends,(long)(local_64 * 2 + 1));
        DistanceGraph::get_link
                  (in_stack_fffffffffffffb50,(sgNodeID_t)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40);
        local_dc = local_f8;
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_60->super_GraphEditorOperation).input_ends,(long)(local_64 * 2 + 1));
        Support::Support(local_118,Undefined,0,0);
        support_00.id = in_stack_fffffffffffffb70;
        support_00._0_8_ = in_stack_fffffffffffffb68;
        DistanceGraph::add_link
                  (&in_stack_fffffffffffffb60->super_DistanceGraph,in_stack_fffffffffffffb58,
                   (sgNodeID_t)in_stack_fffffffffffffb50,
                   (int32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),support_00);
      }
      std::vector<long,_std::allocator<long>_>::operator[]
                (&(local_60->super_GraphEditorOperation).input_nodes,0);
      SequenceDistanceGraph::remove_node(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<GraphEditorNodeExpansion_*,_std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>_>
      ::operator++(&local_20);
    }
    local_120 = (GraphEditorPathDetachment *)
                std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::
                end((vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_> *
                    )in_stack_fffffffffffffaf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
                        *)in_stack_fffffffffffffaf8);
    bVar3 = false;
    if (bVar2) {
      pGVar10 = __gnu_cxx::
                __normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
                ::operator->(&local_28);
      bVar3 = (pGVar10->super_GraphEditorOperation).index == local_30;
    }
    if (bVar3) {
      local_128 = __gnu_cxx::
                  __normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
                  ::operator*(&local_28);
      bVar3 = std::vector<long,_std::allocator<long>_>::empty
                        ((vector<long,_std::allocator<long>_> *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      if (bVar3) {
        if ((local_128->full_detach & 1U) != 0) {
          std::vector<long,_std::allocator<long>_>::operator[]
                    (&(local_128->super_GraphEditorOperation).input_ends,0);
          DistanceGraph::get_fw_links
                    (&in_stack_fffffffffffffb68->super_DistanceGraph,
                     (sgNodeID_t)in_stack_fffffffffffffb60);
          local_130 = local_148;
          local_150._M_current =
               (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                                 ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffaf8);
          local_158 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                        ((vector<Link,_std::allocator<Link>_> *)
                                         in_stack_fffffffffffffaf8);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffb00,
                                    (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffaf8), bVar3) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator*(&local_150);
            memcpy(local_180,pLVar13,0x28);
            lVar1 = local_178;
            pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                                (&(local_128->super_GraphEditorOperation).input_ends,1);
            if (lVar1 != *pvVar12) {
              DistanceGraph::remove_link
                        (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
            }
            __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
            operator++(&local_150);
          }
          std::vector<Link,_std::allocator<Link>_>::~vector
                    ((vector<Link,_std::allocator<Link>_> *)
                     CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
          std::vector<long,_std::allocator<long>_>::operator[]
                    (&(local_128->super_GraphEditorOperation).input_ends,1);
          DistanceGraph::get_bw_links
                    (&in_stack_fffffffffffffb08->super_DistanceGraph,
                     (sgNodeID_t)in_stack_fffffffffffffb00);
          local_188 = local_1a0;
          local_1a8._M_current =
               (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                                 ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffaf8);
          local_1b0 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                        ((vector<Link,_std::allocator<Link>_> *)
                                         in_stack_fffffffffffffaf8);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffb00,
                                    (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffaf8), bVar3) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator*(&local_1a8);
            memcpy(local_1d8,pLVar13,0x28);
            lVar1 = local_1d0;
            pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                                (&(local_128->super_GraphEditorOperation).input_ends,0);
            if (lVar1 != *pvVar12) {
              DistanceGraph::remove_link
                        (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
            }
            __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
            operator++(&local_1a8);
          }
          std::vector<Link,_std::allocator<Link>_>::~vector
                    ((vector<Link,_std::allocator<Link>_> *)
                     CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        }
      }
      else {
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb50,
                   in_stack_fffffffffffffb48);
        SequenceDistanceGraphPath::SequenceDistanceGraphPath
                  ((SequenceDistanceGraphPath *)
                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                   in_stack_fffffffffffffb08,
                   (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb00);
        SequenceDistanceGraphPath::sequence_abi_cxx11_(in_stack_fffffffffffffdb8);
        pSVar11 = (SequenceDistanceGraph *)
                  SequenceDistanceGraph::add_node
                            (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                             SUB81((ulong)in_stack_fffffffffffffaf8 >> 0x38,0));
        std::__cxx11::string::~string(local_200);
        SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x451637)
        ;
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)
                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        in_stack_fffffffffffffb68 = (SequenceDistanceGraph *)*in_RDI;
        local_1e0 = pSVar11;
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&(local_128->super_GraphEditorOperation).input_ends,0);
        in_stack_fffffffffffffb70 = *pvVar12;
        std::vector<long,_std::allocator<long>_>::front
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb00);
        DistanceGraph::get_link
                  (in_stack_fffffffffffffb50,(sgNodeID_t)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40);
        uVar14 = local_258;
        std::vector<long,_std::allocator<long>_>::back
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb00);
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_128->super_GraphEditorOperation).input_ends,1);
        DistanceGraph::get_link
                  (in_stack_fffffffffffffb50,(sgNodeID_t)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40);
        local_26c = local_288;
        if ((local_128->full_detach & 1U) == 0) {
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              (&(local_128->super_GraphEditorOperation).input_ends,0);
          in_stack_fffffffffffffb40 = *pvVar12;
          std::vector<long,_std::allocator<long>_>::front
                    ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb00);
          DistanceGraph::remove_link
                    (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          in_stack_fffffffffffffb48 = (vector<long,_std::allocator<long>_> *)*in_RDI;
          pvVar12 = std::vector<long,_std::allocator<long>_>::back
                              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb00);
          in_stack_fffffffffffffb50 = (DistanceGraph *)-*pvVar12;
          std::vector<long,_std::allocator<long>_>::operator[]
                    (&(local_128->super_GraphEditorOperation).input_ends,1);
          DistanceGraph::remove_link
                    (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        }
        else {
          in_stack_fffffffffffffb60 = (SequenceDistanceGraph *)*in_RDI;
          std::vector<long,_std::allocator<long>_>::operator[]
                    (&(local_128->super_GraphEditorOperation).input_ends,0);
          DistanceGraph::get_fw_links
                    (&in_stack_fffffffffffffb68->super_DistanceGraph,
                     (sgNodeID_t)in_stack_fffffffffffffb60);
          local_2a0 = local_2b8;
          local_2c0._M_current =
               (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                                 ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffaf8);
          local_2c8 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                        ((vector<Link,_std::allocator<Link>_> *)
                                         in_stack_fffffffffffffaf8);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffb00,
                                    (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffaf8), bVar3) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator*(&local_2c0);
            local_2d8 = (pLVar13->support).id;
            local_2f8 = pLVar13->source;
            sStack_2f0 = pLVar13->dest;
            local_2e8 = *(undefined8 *)&pLVar13->dist;
            uStack_2e0._0_1_ = (pLVar13->support).type;
            uStack_2e0._1_1_ = (pLVar13->support).field_0x1;
            uStack_2e0._2_2_ = (pLVar13->support).index;
            uStack_2e0._4_4_ = *(undefined4 *)&(pLVar13->support).field_0x4;
            DistanceGraph::remove_link
                      (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8
                      );
            __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
            operator++(&local_2c0);
          }
          std::vector<Link,_std::allocator<Link>_>::~vector
                    ((vector<Link,_std::allocator<Link>_> *)
                     CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
          in_stack_fffffffffffffb58 = *in_RDI;
          std::vector<long,_std::allocator<long>_>::operator[]
                    (&(local_128->super_GraphEditorOperation).input_ends,1);
          DistanceGraph::get_bw_links
                    (&in_stack_fffffffffffffb08->super_DistanceGraph,
                     (sgNodeID_t)in_stack_fffffffffffffb00);
          local_300 = local_318;
          local_320._M_current =
               (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                                 ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffaf8);
          local_328 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                        ((vector<Link,_std::allocator<Link>_> *)
                                         in_stack_fffffffffffffaf8);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffb00,
                                    (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                     *)in_stack_fffffffffffffaf8), bVar3) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator*(&local_320);
            local_338 = (pLVar13->support).id;
            local_358 = pLVar13->source;
            sStack_350 = pLVar13->dest;
            local_348 = *(undefined8 *)&pLVar13->dist;
            uStack_340._0_1_ = (pLVar13->support).type;
            uStack_340._1_1_ = (pLVar13->support).field_0x1;
            uStack_340._2_2_ = (pLVar13->support).index;
            uStack_340._4_4_ = *(undefined4 *)&(pLVar13->support).field_0x4;
            DistanceGraph::remove_link
                      (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8
                      );
            __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
            operator++(&local_320);
          }
          std::vector<Link,_std::allocator<Link>_>::~vector
                    ((vector<Link,_std::allocator<Link>_> *)
                     CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        }
        in_stack_fffffffffffffaf8 =
             (vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_> *)*in_RDI;
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&(local_128->super_GraphEditorOperation).input_ends,0);
        in_stack_fffffffffffffb00 = (string *)*pvVar12;
        in_stack_fffffffffffffb08 = local_1e0;
        Support::Support(&local_368,Undefined,0,0);
        support_01.id = in_stack_fffffffffffffb70;
        support_01._0_8_ = in_stack_fffffffffffffb68;
        DistanceGraph::add_link
                  (&in_stack_fffffffffffffb60->super_DistanceGraph,in_stack_fffffffffffffb58,
                   (sgNodeID_t)in_stack_fffffffffffffb50,
                   (int32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),support_01);
        std::vector<long,_std::allocator<long>_>::operator[]
                  (&(local_128->super_GraphEditorOperation).input_ends,1);
        Support::Support(&local_378,Undefined,0,0);
        support_02.id = in_stack_fffffffffffffb70;
        support_02._0_8_ = in_stack_fffffffffffffb68;
        DistanceGraph::add_link
                  (&in_stack_fffffffffffffb60->super_DistanceGraph,in_stack_fffffffffffffb58,
                   (sgNodeID_t)in_stack_fffffffffffffb50,
                   (int32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),support_02);
        in_stack_fffffffffffffb14 = uVar14;
      }
      __gnu_cxx::
      __normal_iterator<GraphEditorPathDetachment_*,_std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>_>
      ::operator++(&local_28);
    }
  }
  std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::clear
            ((vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_> *)0x451bfd);
  std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::clear
            ((vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_> *)0x451c11);
  std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::clear
            ((vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_> *)0x451c25
            );
  std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::clear
            ((vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_> *)
             0x451c39);
  in_RDI[0x1c] = 0;
  return;
}

Assistant:

void GraphEditor::apply_all() {
    auto next_node_deletion=node_deletion_queue.begin();
    auto next_link_deletion=link_deletion_queue.begin();
    auto next_expansion=node_expansion_queue.begin();
    auto next_detachment=path_detachment_queue.begin();
    for (uint64_t i=0;i<next_op;++i) {
//    sdglib::OutputLog()<<"Applying all graph edits: "<<node_deletion_queue.size()<<" node deletions, "
//            <<link_deletion_queue.size()<<" link deletions, "
//            <<node_expansion_queue.size()<<" node expansions, "
//            <<path_detachment_queue.size()<<" path detachments"<<std::endl;
        if (next_node_deletion!=node_deletion_queue.end() and next_node_deletion->index==i) {
            auto &op=*next_node_deletion;
            ws.sdg.remove_node(llabs(op.input_nodes[0]));
            ++next_node_deletion;
        }
        if (next_link_deletion!=link_deletion_queue.end() and next_link_deletion->index==i) {
            auto &op=*next_link_deletion;
            ws.sdg.remove_link(op.input_ends[0],op.input_ends[1]);
            ++next_link_deletion;
        }
        if (next_expansion!=node_expansion_queue.end() and next_expansion->index==i) {
            auto &op=*next_expansion;
            for (auto li = 0; li < op.input_ends.size() / 2; ++li) {
                //create a copy of the node;
                auto new_node = ws.sdg.add_node(ws.sdg.get_node_sequence(op.input_nodes[0]));
                //connect to the sides
                auto source_dist = ws.sdg.get_link(op.input_ends[2 * li], op.input_nodes[0]).dist;
                ws.sdg.add_link(op.input_ends[2 * li], new_node, source_dist);
                auto dest_dist = ws.sdg.get_link(-op.input_nodes[0], op.input_ends[2 * li + 1]).dist;
                ws.sdg.add_link(-new_node, op.input_ends[2 * li + 1], dest_dist);
            }
            ws.sdg.remove_node(op.input_nodes[0]);
            ++next_expansion;
        }
        if (next_detachment!=path_detachment_queue.end() and next_detachment->index==i) {
            auto &op=*next_detachment;
            //special case: path with just ends
            if (op.input_nodes.empty()) {
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0]))
                        if (l.dest != op.input_ends[1]) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1]))
                        if (l.dest != op.input_ends[0]) ws.sdg.remove_link(l.source, l.dest);

                }
            } else {
                //Create a unitig with the internal path sequence
                auto new_node = ws.sdg.add_node(SequenceDistanceGraphPath(ws.sdg, op.input_nodes).sequence());
                auto first_dist = ws.sdg.get_link(op.input_ends[0], op.input_nodes.front()).dist;
                auto last_dist = ws.sdg.get_link(-op.input_nodes.back(), op.input_ends[1]).dist;
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0])) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1])) ws.sdg.remove_link(l.source, l.dest);
                }
                else {
                    ws.sdg.remove_link(op.input_ends[0], op.input_nodes.front());
                    ws.sdg.remove_link(-op.input_nodes.back(), op.input_ends[1]);
                }
                ws.sdg.add_link(op.input_ends[0], new_node, first_dist);
                ws.sdg.add_link(-new_node, op.input_ends[1], last_dist);
            }
            ++next_detachment;
        }

    }
    node_deletion_queue.clear();
    link_deletion_queue.clear();
    node_expansion_queue.clear();
    path_detachment_queue.clear();
    next_op=0;
}